

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramBinaryPersistenceCase::test(ProgramBinaryPersistenceCase *this)

{
  size_t *this_00;
  bool bVar1;
  deUint32 program_00;
  TestLog *log_00;
  RenderContext *context;
  MessageBuilder *this_01;
  MessageBuilder local_268;
  undefined1 local_e8 [8];
  ProgramBinary binary;
  Program program;
  undefined1 local_78 [8];
  ShaderAllocator shaders;
  ConstantShaderGenerator sourceGen;
  RenderContext *renderCtx;
  TestLog *log;
  ProgramBinaryPersistenceCase *this_local;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  context = gles3::Context::getRenderContext
                      ((this->super_ProgramBinaryCase).super_TestCase.m_context);
  this_00 = &shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_node_count;
  Functional::anon_unknown_0::ConstantShaderGenerator::ConstantShaderGenerator
            ((ConstantShaderGenerator *)this_00,&this->m_rnd);
  Functional::anon_unknown_0::ShaderAllocator::ShaderAllocator
            ((ShaderAllocator *)local_78,context,(SourceGenerator *)this_00);
  glu::Program::Program
            ((Program *)
             &binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,context);
  buildProgram(this,(Program *)
                    &binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(ShaderAllocator *)local_78);
  bVar1 = glu::Program::getLinkStatus
                    ((Program *)
                     &binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    Functional::anon_unknown_0::ProgramBinary::ProgramBinary((ProgramBinary *)local_e8);
    program_00 = glu::Program::getProgram
                           ((Program *)
                            &binary.data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    ProgramBinaryCase::getProgramBinary
              (&this->super_ProgramBinaryCase,(ProgramBinary *)local_e8,program_00);
    (*(this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6]
    )(this,&binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,local_78);
    (*(this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7]
    )(this,&binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,local_e8);
    Functional::anon_unknown_0::logProgram
              (log_00,context,
               (Program *)
               &binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(ShaderAllocator *)local_78);
    Functional::anon_unknown_0::ProgramBinary::~ProgramBinary((ProgramBinary *)local_e8);
  }
  else {
    tcu::TestLog::operator<<(&local_268,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_268,(char (*) [29])"Fail, couldn\'t link program.");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_268);
    tcu::TestContext::setTestResult
              ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Linking failed");
  }
  glu::Program::~Program
            ((Program *)
             &binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Functional::anon_unknown_0::ShaderAllocator::~ShaderAllocator((ShaderAllocator *)local_78);
  Functional::anon_unknown_0::ConstantShaderGenerator::~ConstantShaderGenerator
            ((ConstantShaderGenerator *)
             &shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void ProgramBinaryPersistenceCase::test (void)
{
	TestLog&				log			= m_testCtx.getLog();
	glu::RenderContext&		renderCtx	= m_context.getRenderContext();

	ConstantShaderGenerator	sourceGen	(m_rnd);

	ShaderAllocator			shaders		(renderCtx, sourceGen);
	glu::Program			program		(renderCtx);

	buildProgram(program, shaders);

	if (program.getLinkStatus())
	{
		ProgramBinary binary;
		getProgramBinary(binary, program.getProgram());

		executeForProgram(program, shaders);

		verify(program, binary);

		logProgram(log, renderCtx, program, shaders);
	}
	else
	{
		log << TestLog::Message << "Fail, couldn't link program." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Linking failed");
	}
}